

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_schemas.cpp
# Opt level: O1

unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> __thiscall
duckdb::DefaultSchemaGenerator::CreateDefaultEntry
          (DefaultSchemaGenerator *this,CatalogTransaction transaction,string *entry_name)

{
  bool bVar1;
  string *in_RDX;
  string local_160;
  undefined1 local_140 [82];
  bool local_ee;
  
  bVar1 = IsDefaultSchema(in_RDX);
  if (bVar1) {
    CreateSchemaInfo::CreateSchemaInfo((CreateSchemaInfo *)local_140);
    StringUtil::Lower(&local_160,in_RDX);
    ::std::__cxx11::string::operator=((string *)(local_140 + 0x30),(string *)&local_160);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p);
    }
    local_ee = true;
    make_uniq_base<duckdb::CatalogEntry,duckdb::DuckSchemaEntry,duckdb::Catalog&,duckdb::CreateSchemaInfo&>
              ((duckdb *)this,(Catalog *)entry_name->_M_string_length,(CreateSchemaInfo *)local_140)
    ;
    CreateInfo::~CreateInfo((CreateInfo *)local_140);
  }
  else {
    (this->super_DefaultGenerator)._vptr_DefaultGenerator = (_func_int **)0x0;
  }
  return (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)
         (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)this;
}

Assistant:

unique_ptr<CatalogEntry> DefaultSchemaGenerator::CreateDefaultEntry(CatalogTransaction transaction,
                                                                    const string &entry_name) {
	if (IsDefaultSchema(entry_name)) {
		CreateSchemaInfo info;
		info.schema = StringUtil::Lower(entry_name);
		info.internal = true;
		return make_uniq_base<CatalogEntry, DuckSchemaEntry>(catalog, info);
	}
	return nullptr;
}